

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# animations.cpp
# Opt level: O2

FDoorAnimation * __thiscall
FTextureManager::FindAnimatedDoor(FTextureManager *this,FTextureID picnum)

{
  FDoorAnimation *pFVar1;
  FDoorAnimation *pFVar2;
  long lVar3;
  FDoorAnimation *pFVar4;
  
  lVar3 = (ulong)(this->mAnimatedDoors).Count + 1;
  pFVar4 = (this->mAnimatedDoors).Array + -1;
  do {
    lVar3 = lVar3 + -1;
    if (lVar3 == 0) {
      return (FDoorAnimation *)0x0;
    }
    pFVar1 = pFVar4 + 1;
    pFVar2 = pFVar4 + 1;
    pFVar4 = pFVar1;
  } while ((pFVar2->BaseTexture).texnum != picnum.texnum);
  return pFVar1;
}

Assistant:

FDoorAnimation *FTextureManager::FindAnimatedDoor (FTextureID picnum)
{
	unsigned int i;

	for (i = 0; i < mAnimatedDoors.Size(); ++i)
	{
		if (picnum == mAnimatedDoors[i].BaseTexture)
			return &mAnimatedDoors[i];
	}

	return NULL;
}